

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode::~SectionNode(SectionNode *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  this->_vptr_SectionNode = (_func_int **)&PTR__SectionNode_00195c18;
  pcVar2 = (this->stdErr)._M_dataplus._M_p;
  paVar1 = &(this->stdErr).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->stdOut)._M_dataplus._M_p;
  paVar1 = &(this->stdOut).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  clara::std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::~vector
            (&this->assertions);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
  ::~vector(&this->childSections);
  SectionStats::~SectionStats(&this->stats);
  return;
}

Assistant:

virtual ~SectionNode() = default;